

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.h
# Opt level: O3

float __thiscall
nv::FloatImage::applyKernel(FloatImage *this,Kernel2 *k,int x,int y,uint c,WrapMode wm)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint e;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  float fVar16;
  
  uVar3 = k->m_windowSize;
  if ((ulong)uVar3 != 0) {
    uVar1 = this->m_width;
    uVar2 = this->m_height;
    iVar11 = 1 - (uVar3 >> 1);
    fVar16 = 0.0;
    uVar10 = 0;
    do {
      uVar5 = y + iVar11 + uVar10;
      uVar7 = 0;
      if (0 < (int)uVar5) {
        uVar7 = uVar5;
      }
      if (uVar2 <= uVar7) {
        uVar7 = uVar2 - 1;
      }
      uVar13 = uVar5;
      if (uVar2 == 1) {
        uVar13 = 0;
      }
      uVar4 = -uVar13;
      if (0 < (int)uVar13) {
        uVar4 = uVar13;
      }
      uVar9 = 0;
      do {
        uVar13 = iVar11 + x + (int)uVar9;
        uVar12 = (uint)uVar2;
        uVar15 = (uint)uVar1;
        if (wm == WrapMode_Repeat) {
          if ((int)uVar5 < 0) {
            uVar12 = ~(~uVar5 % uVar12) + uVar12;
          }
          else {
            uVar12 = uVar5 % uVar12;
          }
          if ((int)uVar13 < 0) {
            uVar13 = ~(~uVar13 % (uint)uVar1) + uVar15;
          }
          else {
            uVar13 = uVar13 % (uint)uVar1;
          }
          iVar14 = uVar12 * uVar15 + uVar13;
        }
        else if (wm == WrapMode_Clamp) {
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          if (uVar15 <= uVar13) {
            uVar13 = uVar1 - 1;
          }
          iVar14 = uVar13 + uVar7 * uVar1;
        }
        else {
          if (uVar1 == 1) {
            uVar13 = 0;
          }
          uVar6 = -uVar13;
          if (0 < (int)uVar13) {
            uVar6 = uVar13;
          }
          while (uVar13 = uVar4, uVar15 <= uVar6) {
            uVar13 = ((uint)uVar1 * 2 + -2) - uVar6;
            uVar6 = -uVar13;
            if (0 < (int)uVar13) {
              uVar6 = uVar13;
            }
          }
          while (uVar12 <= uVar13) {
            uVar8 = ((uint)uVar2 * 2 + -2) - uVar13;
            uVar13 = -uVar8;
            if (0 < (int)uVar8) {
              uVar13 = uVar8;
            }
          }
          iVar14 = uVar13 * uVar15 + uVar6;
        }
        fVar16 = fVar16 + k->m_data[(int)uVar9 + uVar10 * uVar3] *
                          this->m_mem[(ulong)(c * uVar1 * (uint)uVar2) + (long)iVar14];
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar3);
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar3);
    return fVar16;
  }
  return 0.0;
}

Assistant:

uint windowSize() const {
			return m_windowSize;
		}